

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::MessageLite::SerializePartialToArray(MessageLite *this,void *data,int size)

{
  int size_00;
  undefined4 extraout_var;
  LogMessage *pLVar1;
  uint8_t *start;
  string local_88;
  LogMessage local_68;
  ulong local_30;
  size_t byte_size;
  uint8_t *puStack_20;
  int size_local;
  void *data_local;
  MessageLite *this_local;
  
  byte_size._4_4_ = size;
  puStack_20 = (uint8_t *)data;
  data_local = this;
  size_00 = (*this->_vptr_MessageLite[8])();
  local_30 = CONCAT44(extraout_var,size_00);
  if (local_30 < 0x80000000) {
    if ((long)byte_size._4_4_ < (long)local_30) {
      this_local._7_1_ = false;
    }
    else {
      SerializeToArrayImpl(this,puStack_20,size_00);
      this_local._7_1_ = true;
    }
  }
  else {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/message_lite.cc"
               ,0x1e0);
    (*this->_vptr_MessageLite[2])(&local_88);
    pLVar1 = internal::LogMessage::operator<<(&local_68,&local_88);
    pLVar1 = internal::LogMessage::operator<<(pLVar1," exceeded maximum protobuf size of 2GB: ");
    pLVar1 = internal::LogMessage::operator<<(pLVar1,local_30);
    internal::LogFinisher::operator=((LogFinisher *)((long)&start + 3),pLVar1);
    std::__cxx11::string::~string((string *)&local_88);
    internal::LogMessage::~LogMessage(&local_68);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool MessageLite::SerializePartialToArray(void* data, int size) const {
  const size_t byte_size = ByteSizeLong();
  if (byte_size > INT_MAX) {
    GOOGLE_LOG(ERROR) << GetTypeName()
               << " exceeded maximum protobuf size of 2GB: " << byte_size;
    return false;
  }
  if (size < static_cast<int64_t>(byte_size)) return false;
  uint8_t* start = reinterpret_cast<uint8_t*>(data);
  SerializeToArrayImpl(*this, start, byte_size);
  return true;
}